

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O2

Remotes * __thiscall
Omega_h::Dist::exch(Remotes *__return_storage_ptr__,Dist *this,Remotes *data,Int width)

{
  Read<int> idxs;
  Read<int> ranks;
  Write<int> local_90;
  Write<int> local_80;
  Write<int> local_70;
  undefined1 local_60 [32];
  Write<int> local_40;
  
  Write<int>::Write(&local_40,(Write<int> *)data);
  exch<int>((Dist *)(local_60 + 0x10),(Read<int> *)this,(Int)&local_40);
  Write<int>::~Write(&local_40);
  Write<int>::Write(&local_70,&(data->idxs).write_);
  exch<int>((Dist *)local_60,(Read<int> *)this,(Int)&local_70);
  Write<int>::~Write(&local_70);
  Write<int>::Write(&local_80,(Write<int> *)(local_60 + 0x10));
  Write<int>::Write(&local_90,(Write<int> *)local_60);
  Remotes::Remotes(__return_storage_ptr__,(Read<int> *)&local_80,(LOs *)&local_90);
  Write<int>::~Write(&local_90);
  Write<int>::~Write(&local_80);
  Write<int>::~Write((Write<int> *)local_60);
  Write<int>::~Write((Write<int> *)(local_60 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

Remotes Dist::exch(Remotes data, Int width) const {
  auto ranks = exch(data.ranks, width);
  auto idxs = exch(data.idxs, width);
  return Remotes(ranks, idxs);
}